

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
           *this,TilePipelineStateCreateInfo *CI)

{
  IShader *pIVar1;
  undefined8 uVar2;
  void *pvVar3;
  IPipelineResourceSignature **ppIVar4;
  Char *pCVar5;
  Uint64 UVar6;
  ShaderResourceVariableDesc *pSVar7;
  ImmutableSamplerDesc *pIVar8;
  TilePipelineStateCreateInfo *pTVar9;
  Uint8 UVar10;
  TEXTURE_FORMAT TVar11;
  TEXTURE_FORMAT TVar12;
  TEXTURE_FORMAT TVar13;
  Uint32 UVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  SHADER_RESOURCE_VARIABLE_TYPE SVar17;
  undefined3 uVar18;
  SHADER_TYPE SVar19;
  PIPELINE_TYPE PVar20;
  undefined3 uVar21;
  Uint32 UVar22;
  pointer puVar23;
  ulong local_20;
  size_t i;
  TilePipelineStateCreateInfo *CI_local;
  PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  *this_local;
  
  pIVar1 = CI->pTS;
  *(undefined8 *)((this->super_TilePipelineStateCreateInfo).TilePipeline.RTVFormats + 7) =
       *(undefined8 *)((CI->TilePipeline).RTVFormats + 7);
  (this->super_TilePipelineStateCreateInfo).pTS = pIVar1;
  UVar10 = (CI->TilePipeline).SampleCount;
  TVar11 = (CI->TilePipeline).RTVFormats[0];
  TVar12 = (CI->TilePipeline).RTVFormats[1];
  TVar13 = (CI->TilePipeline).RTVFormats[2];
  uVar2 = *(undefined8 *)((CI->TilePipeline).RTVFormats + 3);
  (this->super_TilePipelineStateCreateInfo).TilePipeline.NumRenderTargets =
       (CI->TilePipeline).NumRenderTargets;
  (this->super_TilePipelineStateCreateInfo).TilePipeline.SampleCount = UVar10;
  (this->super_TilePipelineStateCreateInfo).TilePipeline.RTVFormats[0] = TVar11;
  (this->super_TilePipelineStateCreateInfo).TilePipeline.RTVFormats[1] = TVar12;
  (this->super_TilePipelineStateCreateInfo).TilePipeline.RTVFormats[2] = TVar13;
  *(undefined8 *)((this->super_TilePipelineStateCreateInfo).TilePipeline.RTVFormats + 3) = uVar2;
  pvVar3 = (CI->super_PipelineStateCreateInfo).pInternalData;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.pPSOCache =
       (CI->super_PipelineStateCreateInfo).pPSOCache;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData = pvVar3;
  UVar14 = (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
  ppIVar4 = (CI->super_PipelineStateCreateInfo).ppResourceSignatures;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.Flags =
       (CI->super_PipelineStateCreateInfo).Flags;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount =
       UVar14;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures =
       ppIVar4;
  pCVar5 = (CI->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
  PVar20 = (CI->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  uVar21 = *(undefined3 *)&(CI->super_PipelineStateCreateInfo).PSODesc.field_0x9;
  UVar22 = (CI->super_PipelineStateCreateInfo).PSODesc.SRBAllocationGranularity;
  UVar6 = (CI->super_PipelineStateCreateInfo).PSODesc.ImmediateContextMask;
  SVar17 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType;
  uVar18 = *(undefined3 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1;
  SVar19 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages;
  UVar14 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumVariables;
  uVar16 = *(undefined4 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0xc;
  pSVar7 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.Variables;
  uVar15 = *(undefined4 *)&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1c;
  pIVar8 = (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.ImmutableSamplers;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumImmutableSamplers =
       (CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.NumImmutableSamplers;
  *(undefined4 *)
   &(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
    field_0x1c = uVar15;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  ImmutableSamplers = pIVar8;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumVariables = UVar14;
  *(undefined4 *)
   &(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
    field_0xc = uVar16;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  Variables = pSVar7;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  ImmediateContextMask = UVar6;
  pTVar9 = &this->super_TilePipelineStateCreateInfo;
  (pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType = SVar17;
  *(undefined3 *)&(pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1 = uVar18;
  (pTVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages = SVar19
  ;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  super_DeviceObjectAttribs.Name = pCVar5;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.PipelineType =
       PVar20;
  *(undefined3 *)
   &(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.field_0x9 =
       uVar21;
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
  SRBAllocationGranularity = UVar22;
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (&this->ResourceLayout,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::vector(&this->Objects);
  std::
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::vector(&this->Signatures);
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  SetName(this,(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
               super_DeviceObjectAttribs.Name);
  for (local_20 = 0; local_20 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      local_20 = local_20 + 1) {
    AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[local_20]);
  }
  if ((CI->super_PipelineStateCreateInfo).pPSOCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,(CI->super_PipelineStateCreateInfo).pPSOCache);
  }
  memcpy(&(this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
          ResourceLayout,&this->ResourceLayout,0x28);
  puVar23 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      (&this->InternalData);
  (this->super_TilePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData = puVar23;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }